

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typename.cc
# Opt level: O3

string * Typelib::getNamespace(string *__return_storage_ptr__,string *name)

{
  _List_node_base *p_Var1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  splitTypename((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68,name);
  if (local_68._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_68) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/","");
  }
  else {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_68,(iterator)local_68._M_impl._M_node.super__List_node_base._M_prev);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_68._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_68) {
      p_Var1 = local_68._M_impl._M_node.super__List_node_base._M_next;
      do {
        std::operator+(&local_50,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1));
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var1 != (_List_node_base *)&local_68);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string getNamespace(const std::string& name)
    {
        list<string> split = splitTypename(name);
        if (split.empty())
            return "/";
        split.pop_back();

        std::string result;
        for (list<string>::const_iterator it = split.begin(); it != split.end(); ++it)
            result += "/" + *it;

        result += "/";
        return result;
    }